

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Api.cpp
# Opt level: O0

void js_memset_zero_nontemporal(void *dst,size_t sizeInBytes)

{
  undefined8 *local_70;
  __m128i *p;
  __m128i simdZero;
  ulong local_50;
  size_t writeBytes;
  size_t sizeInBytes_local;
  void *dst_local;
  
  if ((sizeInBytes & 0xf) == 0) {
    local_70 = (undefined8 *)dst;
    for (local_50 = 0; local_50 < sizeInBytes; local_50 = local_50 + 0x10) {
      *local_70 = 0;
      local_70[1] = 0;
      local_70 = local_70 + 2;
    }
  }
  else {
    memset(dst,0,sizeInBytes);
  }
  return;
}

Assistant:

void __stdcall js_memset_zero_nontemporal(__bcount(sizeInBytes) void *dst, size_t sizeInBytes)
{
    if ((sizeInBytes % sizeof(__m128i)) == 0)
    {
        size_t writeBytes = 0;
        __m128i simdZero = _mm_setzero_si128();
        for (__m128i * p = (__m128i *)dst; writeBytes < sizeInBytes; p += 1, writeBytes += sizeof(__m128i))
        {
            _mm_stream_si128(p, simdZero);
        }

        _mm_sfence();
    }
    // cannot do non-temporal store directly if set size is not multiple of sizeof(__m128i)
    else
    {
        memset(dst, 0, sizeInBytes);
    }
}